

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

Inta_Man_t * Inta_ManAlloc(void)

{
  Inta_Man_t *__s;
  Vec_Int_t *pVVar1;
  Inta_Man_t *p;
  
  __s = (Inta_Man_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  pVVar1 = Vec_IntAlloc(1000);
  __s->vResLits = pVVar1;
  __s->fProofWrite = 0;
  __s->fProofVerif = 1;
  return __s;
}

Assistant:

Inta_Man_t * Inta_ManAlloc()
{
    Inta_Man_t * p;
    // allocate the manager
    p = (Inta_Man_t *)ABC_ALLOC( char, sizeof(Inta_Man_t) );
    memset( p, 0, sizeof(Inta_Man_t) );
    // verification
    p->vResLits = Vec_IntAlloc( 1000 );
    // parameters
    p->fProofWrite = 0;
    p->fProofVerif = 1;
    return p;    
}